

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall BaseSocketImpl::StartClosingCB(BaseSocketImpl *this)

{
  mutex *__mutex;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  __mutex = &this->m_mxFnClosing;
  std::mutex::lock(__mutex);
  local_28 = (this->m_fClosingParam).super__Function_base._M_manager;
  if (local_28 == (_Manager_type)0x0) {
    local_28 = (this->m_fClosing).super__Function_base._M_manager;
    if (local_28 == (_Manager_type)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    local_38._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(this->m_fClosing).super__Function_base._M_functor;
    local_38._8_8_ = *(undefined8 *)((long)&(this->m_fClosing).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->m_fClosing).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->m_fClosing).super__Function_base._M_functor + 8) = 0;
    (this->m_fClosing).super__Function_base._M_manager = (_Manager_type)0x0;
    local_20 = (_Invoker_type)(this->m_fClosing)._M_invoker;
    (this->m_fClosing)._M_invoker = (_Invoker_type)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::function<void_(BaseSocket_*)>::operator()
              ((function<void_(BaseSocket_*)> *)&local_38,this->m_pBkRef);
  }
  else {
    local_38._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(this->m_fClosingParam).super__Function_base._M_functor;
    local_38._8_8_ =
         *(undefined8 *)((long)&(this->m_fClosingParam).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->m_fClosingParam).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->m_fClosingParam).super__Function_base._M_functor + 8) = 0;
    (this->m_fClosingParam).super__Function_base._M_manager = (_Manager_type)0x0;
    local_20 = (this->m_fClosingParam)._M_invoker;
    (this->m_fClosingParam)._M_invoker = (_Invoker_type)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::function<void_(BaseSocket_*,_void_*)>::operator()
              ((function<void_(BaseSocket_*,_void_*)> *)&local_38,this->m_pBkRef,this->m_pvUserData)
    ;
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

void BaseSocketImpl::StartClosingCB()
{
    m_mxFnClosing.lock();
    if (m_fClosingParam)
    {
        function<void(BaseSocket*, void*)> tmpfun;
        m_fClosingParam.swap(tmpfun);
        m_mxFnClosing.unlock();
        tmpfun(m_pBkRef, m_pvUserData);
    }
    else if (m_fClosing)
    {
        function<void(BaseSocket*)> tmpfun;
        m_fClosing.swap(tmpfun);
        m_mxFnClosing.unlock();
        tmpfun(m_pBkRef);
    }
    else
        m_mxFnClosing.unlock();
}